

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

void __thiscall
ExtraData::parseVT_ERROR
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int from,int to)

{
  longlong errorType;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  longlong local_28;
  longlong errorVal;
  int to_local;
  int from_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *val_local;
  ExtraData *this_local;
  
  errorVal._0_4_ = to;
  errorVal._4_4_ = from;
  _to_local = val;
  val_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,val);
  errorType = Utils::vectEightBytesToUnsignedInt(&local_40,errorVal._4_4_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
  local_28 = errorType;
  ExtraDataUtils::parseError(errorType);
  return;
}

Assistant:

void ExtraData::parseVT_ERROR(std::vector<unsigned int> val, int from, int to) {
    long long int errorVal = Utils::vectEightBytesToUnsignedInt(val, from);
    ExtraDataUtils::parseError(errorVal );
}